

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_status dump_list_binary(nbt_list *list,buffer *b)

{
  int iVar1;
  nbt_status nVar2;
  nbt_status ret;
  nbt_list *entry;
  list_head *pos;
  int32_t dumped_len;
  int8_t _type;
  size_t len;
  buffer *pbStack_20;
  nbt_type type;
  buffer *b_local;
  nbt_list *list_local;
  
  pbStack_20 = b;
  b_local = (buffer *)list;
  len._4_4_ = list_is_homogenous(list);
  _dumped_len = list_length((list_head *)&b_local->len);
  if (_dumped_len < 0x80000000) {
    if (len._4_4_ == TAG_INVALID) {
      __assert_fail("type != TAG_INVALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c"
                    ,0x2cf,"nbt_status dump_list_binary(const struct nbt_list *, struct buffer *)");
    }
    if (len._4_4_ == TAG_INVALID) {
      list_local._4_4_ = NBT_ERR;
    }
    else {
      pos._7_1_ = (undefined1)len._4_4_;
      be2ne((void *)((long)&pos + 7),1);
      iVar1 = buffer_append(pbStack_20,(void *)((long)&pos + 7),1);
      if (iVar1 == 0) {
        pos._0_4_ = (undefined4)_dumped_len;
        be2ne(&pos,4);
        iVar1 = buffer_append(pbStack_20,&pos,4);
        if (iVar1 == 0) {
          for (entry = (nbt_list *)b_local->cap; entry != (nbt_list *)&b_local->len;
              entry = (nbt_list *)(entry->entry).blink) {
            nVar2 = __dump_binary((nbt_node *)entry[-1].entry.flink,false,pbStack_20);
            if (nVar2 != NBT_OK) {
              return nVar2;
            }
          }
          list_local._4_4_ = NBT_OK;
        }
        else {
          list_local._4_4_ = NBT_EMEM;
        }
      }
      else {
        list_local._4_4_ = NBT_EMEM;
      }
    }
  }
  else {
    list_local._4_4_ = NBT_ERR;
  }
  return list_local._4_4_;
}

Assistant:

static nbt_status dump_list_binary(const struct nbt_list* list, struct buffer* b)
{
    nbt_type type = list_is_homogenous(list);

    size_t len = list_length(&list->entry);

    if(len > 2147483647 /* INT_MAX */)
        return NBT_ERR;

    assert(type != TAG_INVALID);

    if(type == TAG_INVALID)
        return NBT_ERR;

    {
        int8_t _type = (int8_t)type;
        ne2be(&_type, sizeof _type); /* unnecessary, but left in to keep similar code looking similar */
        CHECKED_APPEND(b, &_type, sizeof _type);
    }

    {
        int32_t dumped_len = (int32_t)len;
        ne2be(&dumped_len, sizeof dumped_len);
        CHECKED_APPEND(b, &dumped_len, sizeof dumped_len);
    }

    const struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* entry = list_entry(pos, const struct nbt_list, entry);
        nbt_status ret;

        if((ret = __dump_binary(entry->data, false, b)) != NBT_OK)
            return ret;
    }

    return NBT_OK;
}